

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O2

void Hop_ObjPrintVerilog(FILE *pFile,Hop_Obj_t *pObj,Vec_Vec_t *vLevels,int Level,int fOnlyAnds)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  char *pcVar5;
  Hop_Obj_t *pHVar6;
  char *pcVar7;
  uint uVar8;
  ulong local_60;
  Hop_Obj_t *pFanin1;
  Hop_Obj_t *pFanin0;
  
  uVar8 = (uint)pObj;
  pHVar6 = (Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  iVar1 = Hop_ObjIsConst1(pHVar6);
  if (iVar1 != 0) {
    fprintf((FILE *)pFile,"1\'b%d",(ulong)(uVar8 & 1 ^ 1));
    return;
  }
  local_60 = (ulong)pObj & 1;
  uVar2 = *(uint *)&pHVar6->field_0x20 & 7;
  if (uVar2 == 2) {
    pcVar5 = "~";
    if ((int)local_60 == 0) {
      pcVar5 = "";
    }
    fprintf((FILE *)pFile,"%s%s",pcVar5,(pHVar6->field_0).pData);
    return;
  }
  if (fOnlyAnds == 0) {
    if (uVar2 == 5) {
      Vec_VecExpand(vLevels,Level);
      pVVar3 = Vec_VecEntry(vLevels,Level);
      Hop_ObjCollectMulti(pHVar6,pVVar3);
      pcVar5 = "(";
      if (Level == 0) {
        pcVar5 = "";
      }
      fputs(pcVar5,(FILE *)pFile);
      for (iVar1 = 0; iVar1 < pVVar3->nSize; iVar1 = iVar1 + 1) {
        pvVar4 = Vec_PtrEntry(pVVar3,iVar1);
        Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)
                                  ((ulong)(iVar1 == 0 & (byte)local_60) ^ (ulong)pvVar4),vLevels,
                            Level + 1,0);
        if (iVar1 < pVVar3->nSize + -1) {
          fwrite(" ^ ",3,1,(FILE *)pFile);
        }
      }
      pcVar5 = ")";
      if (Level == 0) {
        pcVar5 = "";
      }
      goto LAB_00660044;
    }
    iVar1 = Hop_ObjIsMuxType(pHVar6);
    if (iVar1 != 0) {
      iVar1 = Hop_ObjRecognizeExor(pHVar6,&pFanin0,&pFanin1);
      if (iVar1 == 0) {
        pHVar6 = Hop_ObjRecognizeMux(pHVar6,&pFanin1,&pFanin0);
        pcVar7 = "(";
        if (Level == 0) {
          pcVar7 = "";
        }
        pcVar5 = ")";
        if (Level == 0) {
          pcVar5 = "";
        }
        fputs(pcVar7,(FILE *)pFile);
        Hop_ObjPrintVerilog(pFile,pHVar6,vLevels,Level + 1,0);
        fwrite(" ? ",3,1,(FILE *)pFile);
        Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)pFanin1 ^ (ulong)(uVar8 & 1)),vLevels,
                            Level + 1,0);
        fwrite(" : ",3,1,(FILE *)pFile);
        pFanin1 = (Hop_Obj_t *)((ulong)(uVar8 & 1) ^ (ulong)pFanin0);
      }
      else {
        pcVar7 = "(";
        if (Level == 0) {
          pcVar7 = "";
        }
        pcVar5 = ")";
        if (Level == 0) {
          pcVar5 = "";
        }
        fputs(pcVar7,(FILE *)pFile);
        Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)(uVar8 & 1) ^ (ulong)pFanin0),vLevels,
                            Level + 1,0);
        fwrite(" ^ ",3,1,(FILE *)pFile);
      }
      Hop_ObjPrintVerilog(pFile,pFanin1,vLevels,Level + 1,0);
      goto LAB_00660044;
    }
  }
  Vec_VecExpand(vLevels,Level);
  pVVar3 = Vec_VecEntry(vLevels,Level);
  Hop_ObjCollectMulti(pHVar6,pVVar3);
  pcVar5 = "(";
  if (Level == 0) {
    pcVar5 = "";
  }
  fputs(pcVar5,(FILE *)pFile);
  pcVar5 = "|";
  if ((int)local_60 == 0) {
    pcVar5 = "&";
  }
  for (iVar1 = 0; iVar1 < pVVar3->nSize; iVar1 = iVar1 + 1) {
    pvVar4 = Vec_PtrEntry(pVVar3,iVar1);
    Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)pvVar4 ^ (ulong)(uVar8 & 1)),vLevels,Level + 1,
                        fOnlyAnds);
    if (iVar1 < pVVar3->nSize + -1) {
      fprintf((FILE *)pFile," %s ",pcVar5);
    }
  }
  pcVar5 = ")";
  if (Level == 0) {
    pcVar5 = "";
  }
LAB_00660044:
  fputs(pcVar5,(FILE *)pFile);
  return;
}

Assistant:

void Hop_ObjPrintVerilog( FILE * pFile, Hop_Obj_t * pObj, Vec_Vec_t * vLevels, int Level, int fOnlyAnds )
{
    Vec_Ptr_t * vSuper;
    Hop_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Hop_IsComplement(pObj);
    pObj = Hop_Regular(pObj);
    // constant case
    if ( Hop_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Hop_ObjIsPi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( !fOnlyAnds && Hop_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Hop_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
        {
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1, fOnlyAnds );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( !fOnlyAnds && Hop_ObjIsMuxType(pObj) )
    {
        if ( Hop_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ^ " );
            Hop_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Hop_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ? " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin1, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " : " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Hop_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
    {
        Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, fCompl), vLevels, Level+1, fOnlyAnds );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}